

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O0

bool __thiscall xLearn::Checker::check_train_param(Checker *this,HyperParam *hyper_param)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  HyperParam *in_RSI;
  Checker *in_RDI;
  bool bo;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  string local_190 [32];
  string local_170 [24];
  char *in_stack_fffffffffffffea8;
  string local_150 [32];
  string local_130 [32];
  string local_110 [24];
  string local_f0 [32];
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [39];
  bool local_19;
  bool local_1;
  
  local_19 = true;
  if ((in_RSI->from_file & 1U) == 0) {
    bVar1 = in_RSI->train_dataset == (DMatrix *)0x0;
    if (bVar1) {
      StringPrintf_abi_cxx11_((char *)local_90,"Training dataset is None, please check!");
      Color::print_error(in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_90);
    }
    local_19 = !bVar1;
  }
  else {
    std::__cxx11::string::c_str();
    bVar1 = FileExist(in_stack_fffffffffffffea8);
    if (!bVar1) {
      uVar3 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_40,"Training data file: %s does not exist.",uVar3);
      Color::print_error(in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_40);
      local_19 = false;
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::c_str();
      bVar1 = FileExist(in_stack_fffffffffffffea8);
      if (!bVar1) {
        uVar3 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_((char *)local_70,"Validation data file: %s does not exist.",uVar3);
        Color::print_error(in_stack_fffffffffffffe20);
        std::__cxx11::string::~string(local_70);
        local_19 = false;
      }
    }
  }
  if (in_RSI->thread_number < 0) {
    in_stack_fffffffffffffe48 = local_b0;
    StringPrintf_abi_cxx11_
              ((char *)in_stack_fffffffffffffe48,"The thread number must be greater than zero: %d.",
               (ulong)(uint)in_RSI->thread_number);
    Color::print_error(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string((string *)local_b0);
    local_19 = false;
  }
  iVar2 = std::__cxx11::string::compare((char *)&in_RSI->loss_func);
  if (iVar2 == 0) {
    in_stack_fffffffffffffe40 = local_d0;
    StringPrintf_abi_cxx11_
              ((char *)in_stack_fffffffffffffe40,"The task can only be \'binary\' or \'reg\'.");
    Color::print_error(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_d0);
    local_19 = false;
  }
  iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric);
  if ((((((iVar2 != 0) &&
         (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0)) &&
        (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0)) &&
       (((iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0 &&
         (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0)) &&
        ((iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0 &&
         ((iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0 &&
          (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0)))))))) &&
      (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0)) &&
     (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric), iVar2 != 0)) {
    uVar3 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)local_f0,"Unknow evaluation metric: %s.",uVar3);
    Color::print_error(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_f0);
    local_19 = false;
  }
  iVar2 = std::__cxx11::string::compare((char *)&in_RSI->opt_type);
  if (((iVar2 != 0) &&
      (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->opt_type), iVar2 != 0)) &&
     (iVar2 = std::__cxx11::string::compare((char *)&in_RSI->opt_type), iVar2 != 0)) {
    uVar3 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)local_110,"Unknow optimization method: %s.",uVar3);
    Color::print_error(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_110);
    local_19 = false;
  }
  if (999999 < in_RSI->num_K) {
    StringPrintf_abi_cxx11_
              ((char *)local_130,"Invalid size of K: %d. Size of K must be greater than zero.",
               (ulong)in_RSI->num_K);
    Color::print_error(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_130);
    local_19 = false;
  }
  if (in_RSI->num_folds < 1) {
    in_stack_fffffffffffffe20 = local_150;
    StringPrintf_abi_cxx11_
              ((char *)in_stack_fffffffffffffe20,
               "Invalid size of folds: %d. Size of folds must be greater than zero.",
               (ulong)(uint)in_RSI->num_folds);
    Color::print_error(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string((string *)local_150);
    local_19 = false;
  }
  if (in_RSI->num_epoch < 1) {
    StringPrintf_abi_cxx11_
              ((char *)local_170,
               "Invalid number of epoch: %d. Number of epoch must be greater than zero.",
               (ulong)(uint)in_RSI->num_epoch);
    Color::print_error(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_170);
    local_19 = false;
  }
  if ((local_19 & 1U) == 0) {
    local_1 = false;
  }
  else {
    check_conflict_train(in_RDI,in_RSI);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) != 0) && ((in_RSI->cross_validation & 1U) == 0)) {
      std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
      std::__cxx11::string::operator=((string *)&in_RSI->model_file,local_190);
      std::__cxx11::string::~string(local_190);
    }
    iVar2 = std::__cxx11::string::compare((char *)&in_RSI->metric);
    if (iVar2 == 0) {
      std::__cxx11::string::operator=((string *)&in_RSI->metric,"rmsd");
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Checker::check_train_param(HyperParam& hyper_param) {
  bool bo = true;
  /*********************************************************
   *  Check file path                                      *
   *********************************************************/
  if (hyper_param.from_file) {
    if (!FileExist(hyper_param.train_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Training data file: %s does not exist.", 
                      hyper_param.train_set_file.c_str())
      );
      bo = false;
    }
    if (!hyper_param.validate_set_file.empty() &&
        !FileExist(hyper_param.validate_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Validation data file: %s does not exist.", 
                      hyper_param.validate_set_file.c_str())
      );
      bo = false;
    }  
  } else {
    if (hyper_param.train_dataset == nullptr) {
      Color::print_error(
        StringPrintf("Training dataset is None, please check!")
      );
      bo = false;
    }
  }
  /*********************************************************
   *  Check invalid value                                  *
   *********************************************************/
  if (hyper_param.thread_number < 0) {
    Color::print_error(
      StringPrintf("The thread number must be greater than zero: %d.",
        hyper_param.thread_number)
    );
    bo = false;
  }
  if (hyper_param.loss_func.compare("unknow") == 0) {
    Color::print_error(
      StringPrintf("The task can only be 'binary' or 'reg'.")
    );
    bo = false;
  }
  if (hyper_param.metric.compare("acc") != 0 &&
      hyper_param.metric.compare("prec") != 0 &&
      hyper_param.metric.compare("recall") != 0 &&
      hyper_param.metric.compare("f1") != 0 &&
      hyper_param.metric.compare("auc") != 0 &&
      hyper_param.metric.compare("mae") != 0 &&
      hyper_param.metric.compare("mape") != 0 &&
      hyper_param.metric.compare("rmsd") != 0 &&
      hyper_param.metric.compare("rmse") != 0 &&
      hyper_param.metric.compare("none") != 0) {
    Color::print_error(
      StringPrintf("Unknow evaluation metric: %s.",
        hyper_param.metric.c_str())
    );
    bo = false;
  }
  if (hyper_param.opt_type.compare("sgd") != 0 &&
      hyper_param.opt_type.compare("ftrl") != 0 &&
      hyper_param.opt_type.compare("adagrad") != 0) {
    Color::print_error(
      StringPrintf("Unknow optimization method: %s.",
        hyper_param.opt_type.c_str())
    );
    bo = false;
  }
  if (hyper_param.num_K > 999999) {
    Color::print_error(
      StringPrintf("Invalid size of K: %d. "
                   "Size of K must be greater than zero.", 
        hyper_param.num_K)
    );
    bo = false;
  }
  if (hyper_param.num_folds <= 0) {
    Color::print_error(
      StringPrintf("Invalid size of folds: %d. "
                   "Size of folds must be greater than zero.", 
        hyper_param.num_folds)
    );
    bo = false;
  }
  if (hyper_param.num_epoch <= 0) {
    Color::print_error(
      StringPrintf("Invalid number of epoch: %d. "
                   "Number of epoch must be greater than zero.", 
        hyper_param.num_epoch)
    );
    bo = false;
  }
  if (!bo) return false;
  /*********************************************************
   *  Check warning and fix conflict                       *
   *********************************************************/
  check_conflict_train(hyper_param);
  /*********************************************************
   *  Set default value                                    *
   *********************************************************/
  if (hyper_param.model_file.empty() && !hyper_param.cross_validation) {
    hyper_param.model_file = hyper_param.train_set_file + ".model";
  }
  if (hyper_param.metric.compare("rmse") == 0) {
    hyper_param.metric = "rmsd";
  }

  return true;
}